

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontGlyphRangesBuilder::AddRanges(ImFontGlyphRangesBuilder *this,ImWchar *ranges)

{
  uint *puVar1;
  ushort uVar2;
  long lVar3;
  ushort uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar4 = *ranges;
  if (uVar4 != 0) {
    lVar3 = *(long *)(this + 8);
    do {
      uVar2 = ranges[1];
      if (uVar4 <= uVar2) {
        uVar5 = (uint)uVar4;
        do {
          puVar1 = (uint *)(lVar3 + (ulong)(uVar5 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)uVar5 & 0x1f);
          bVar6 = uVar5 < uVar2;
          uVar5 = uVar5 + 1;
        } while (bVar6);
      }
      uVar4 = ranges[2];
      ranges = ranges + 2;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (unsigned int c = ranges[0]; c <= ranges[1] && c <= IM_UNICODE_CODEPOINT_MAX; c++) //-V560
            AddChar((ImWchar)c);
}